

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_literal_string<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  size_type sVar1;
  value_type *pvVar2;
  error_type *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_value<toml::type_config> *v_00;
  basic_value<toml::type_config> *ctx_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  type val;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  val_res;
  location first;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string_type local_3f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  region local_3c0;
  region_type local_358;
  result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
  local_2f0;
  location local_260;
  basic_value<toml::type_config> local_218;
  basic_value<toml::type_config> local_150;
  failure<toml::error_info> local_88;
  
  location::location(&local_260,loc);
  parse_literal_string_only<toml::type_config>(&local_2f0,loc,ctx);
  if (local_2f0.is_ok_ == false) {
    v = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
        ::unwrap_err(&local_2f0,(source_location)0x4d0128);
    err<toml::error_info>(&local_88,v);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
  }
  else {
    pvVar2 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_2f0,(source_location)0x4d0140);
    local_418 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pvVar2->first)._M_dataplus._M_p;
    paVar3 = &(pvVar2->first).field_2;
    if (local_418 == paVar3) {
      local_408._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_408._8_8_ = *(undefined8 *)((long)&(pvVar2->first).field_2 + 8);
      local_418 = &local_408;
    }
    else {
      local_408._M_allocated_capacity = paVar3->_M_allocated_capacity;
    }
    sVar1 = (pvVar2->first)._M_string_length;
    (pvVar2->first)._M_dataplus._M_p = (pointer)paVar3;
    (pvVar2->first)._M_string_length = 0;
    (pvVar2->first).field_2._M_local_buf[0] = '\0';
    pvVar2 = result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_2f0,(source_location)0x4d0158);
    local_358.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (pvVar2->second).source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_3c0.source_name_._M_dataplus._M_p = (pointer)&local_3c0.source_name_.field_2;
    local_358.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (pvVar2->second).source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (pvVar2->second).source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pvVar2->second).source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_358.source_name_._M_dataplus._M_p = (pvVar2->second).source_name_._M_dataplus._M_p;
    paVar4 = &(pvVar2->second).source_name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358.source_name_._M_dataplus._M_p == paVar4) {
      local_3c0.source_name_.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_3c0.source_name_.field_2._8_8_ =
           *(undefined8 *)((long)&(pvVar2->second).source_name_.field_2 + 8);
      local_358.source_name_._M_dataplus._M_p = local_3c0.source_name_._M_dataplus._M_p;
    }
    else {
      local_3c0.source_name_.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_358.source_name_._M_string_length = (pvVar2->second).source_name_._M_string_length;
    (pvVar2->second).source_name_._M_dataplus._M_p = (pointer)paVar4;
    (pvVar2->second).source_name_._M_string_length = 0;
    (pvVar2->second).source_name_.field_2._M_local_buf[0] = '\0';
    local_3c0.last_column_ = (pvVar2->second).last_column_;
    local_3c0.length_ = (pvVar2->second).length_;
    local_3c0.first_ = (pvVar2->second).first_;
    local_3c0.first_line_ = (pvVar2->second).first_line_;
    local_3c0.first_column_ = (pvVar2->second).first_column_;
    local_3c0.last_ = (pvVar2->second).last_;
    local_3c0.last_line_ = (pvVar2->second).last_line_;
    if (local_418 == &local_408) {
      local_3f8.field_2._8_8_ = local_408._8_8_;
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    }
    else {
      local_3f8._M_dataplus._M_p = (pointer)local_418;
    }
    local_3f8.field_2._M_allocated_capacity = local_408._M_allocated_capacity;
    local_408._M_allocated_capacity = local_408._M_allocated_capacity & 0xffffffffffffff00;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c0.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_3c0.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_358.source_name_._M_dataplus._M_p == local_3c0.source_name_._M_dataplus._M_p) {
      local_358.source_name_.field_2._8_8_ = local_3c0.source_name_.field_2._8_8_;
      local_358.source_name_._M_dataplus._M_p = (pointer)&local_358.source_name_.field_2;
    }
    local_358.source_name_.field_2._M_allocated_capacity =
         local_3c0.source_name_.field_2._M_allocated_capacity;
    local_3c0.source_name_._M_string_length = 0;
    local_3c0.source_name_.field_2._M_allocated_capacity =
         local_3c0.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_3f8._M_string_length = sVar1;
    local_358.length_ = local_3c0.length_;
    local_358.first_ = local_3c0.first_;
    local_358.first_line_ = local_3c0.first_line_;
    local_358.first_column_ = local_3c0.first_column_;
    local_358.last_ = local_3c0.last_;
    local_358.last_line_ = local_3c0.last_line_;
    local_358.last_column_ = local_3c0.last_column_;
    basic_value<toml::type_config>::basic_value
              (&local_218,&local_3f8,(string_format_info)0x1,&local_3d8,&local_358);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_150,(toml *)&local_218,v_00)
    ;
    __return_storage_ptr__->is_ok_ = true;
    ctx_00 = &local_150;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,&local_150);
    basic_value<toml::type_config>::cleanup(&local_150,(EVP_PKEY_CTX *)ctx_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_150.comments_);
    region::~region(&local_150.region_);
    basic_value<toml::type_config>::cleanup(&local_218,(EVP_PKEY_CTX *)ctx_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_218.comments_);
    region::~region(&local_218.region_);
    region::~region(&local_358);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    region::~region(&local_3c0);
  }
  if (local_2f0.is_ok_ == true) {
    success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
    ::~success(&local_2f0.field_1.succ_);
  }
  else {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_2f0.field_1.succ_);
  }
  location::~location(&local_260);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_literal_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    string_format_info fmt;
    fmt.fmt = string_format::literal;

    auto val_res = parse_literal_string_only(loc, ctx);
    if(val_res.is_err())
    {
        return err(std::move(val_res.unwrap_err()));
    }
    auto val = std::move(val_res.unwrap().first );
    auto reg = std::move(val_res.unwrap().second);

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}